

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManGroupProve(Gia_Man_t *pInit,char *pCommLine,int nGroupSize,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  uint *__ptr;
  int iVar3;
  Abc_Frame_t *pAVar4;
  Gia_Man_t *pGVar5;
  void *pvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void **ppvVar9;
  Gia_Man_t *pNew;
  Abc_Cex_t *pAVar10;
  Vec_Int_t *pVVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  double dVar21;
  timespec ts;
  Vec_Ptr_t *vCexes;
  timespec local_a8;
  Vec_Ptr_t *local_98;
  char *local_90;
  double local_88;
  uint *local_80;
  Abc_Frame_t *local_78;
  long local_70;
  long local_68;
  long local_60;
  ulong local_58;
  Gia_Man_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_90 = pCommLine;
  pAVar4 = Abc_FrameReadGlobalFrame();
  pGVar5 = Gia_ManDup(pInit);
  iVar18 = 3;
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    lVar17 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  if (nGroupSize < 1) {
    __assert_fail("nGroupSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x734,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (local_90 == (char *)0x0) {
    __assert_fail("pCommLine != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x735,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  local_78 = pAVar4;
  if (pGVar5->nConstrs != 0) {
    __assert_fail("p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x736,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  pvVar6 = (void *)0x0;
  Abc_Print(iVar18,"RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n",
            (ulong)(uint)nGroupSize,local_90);
  pVVar7 = pGVar5->vCos;
  uVar20 = pVVar7->nSize - pGVar5->nRegs;
  local_80 = (uint *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar20 - 1) {
    uVar14 = uVar20;
  }
  local_80[1] = 0;
  *local_80 = uVar14;
  if (uVar14 != 0) {
    pvVar6 = malloc((long)(int)uVar14 << 2);
  }
  *(void **)(local_80 + 2) = pvVar6;
  local_80[1] = uVar20;
  if (0 < (int)uVar20) {
    uVar15 = 0;
    do {
      *(int *)((long)pvVar6 + uVar15 * 4) = (int)uVar15;
      uVar15 = uVar15 + 1;
    } while (uVar20 != uVar15);
  }
  iVar18 = pVVar7->nSize - pGVar5->nRegs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar3 = iVar18;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar3;
  if (iVar3 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar7->pArray = piVar8;
  local_98 = (Vec_Ptr_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < iVar18 - 1U) {
    iVar3 = iVar18;
  }
  local_98->nSize = 0;
  local_98->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)iVar3 << 3);
  }
  local_98->pArray = ppvVar9;
  uVar20 = (uint)(0 < iVar18 % nGroupSize);
  uVar14 = uVar20 + iVar18 / nGroupSize;
  if (uVar14 == 0 || SCARRY4(uVar20,iVar18 / nGroupSize) != (int)uVar14 < 0) {
    dVar21 = 0.0;
  }
  else {
    local_48 = (ulong)(uint)nGroupSize;
    local_58 = (ulong)uVar14;
    lVar13 = 0;
    uVar15 = 0;
    local_60 = lVar17;
    local_50 = pGVar5;
    do {
      local_40 = uVar15 + 1;
      iVar3 = local_50->vCos->nSize - local_50->nRegs;
      uVar20 = (int)uVar15 * nGroupSize;
      uVar14 = iVar3 - uVar20;
      if ((int)local_40 * nGroupSize < iVar3) {
        uVar14 = nGroupSize;
      }
      lVar17 = uVar15 * local_48;
      pGVar5 = local_50;
      local_38 = lVar13;
      pNew = Gia_ManDupCones(local_50,(int *)(lVar17 * 4 + *(long *)(local_80 + 2)),uVar14,0);
      Abc_Print((int)pGVar5,"GROUP %4d : %4d <= PoId < %4d : ",uVar15 & 0xffffffff,(ulong)uVar20,
                (ulong)((int)lVar17 + uVar14));
      pAVar4 = local_78;
      Abc_FrameUpdateGia(local_78,pNew);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_68 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        local_68 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_a8.tv_sec * -1000000;
      }
      Cmd_CommandExecute(pAVar4,local_90);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_70 = -1;
      }
      else {
        local_70 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      if (nGroupSize == 1) {
        iVar3 = Abc_FrameReadProbStatus(pAVar4);
        Vec_IntPush(pVVar7,iVar3);
        pVVar12 = local_98;
        pAVar10 = Abc_FrameReadCex(pAVar4);
        uVar14 = pVVar12->nCap;
        if (pVVar12->nSize == uVar14) {
          if ((int)uVar14 < 0x10) {
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar12->pArray,0x80);
            }
            pVVar12->pArray = ppvVar9;
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar14 * 2;
            if (iVar3 <= (int)uVar14) goto LAB_0078ba24;
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar14 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar12->pArray,(ulong)uVar14 << 4);
            }
            pVVar12->pArray = ppvVar9;
          }
          pVVar12->nCap = iVar3;
        }
LAB_0078ba24:
        iVar3 = pVVar12->nSize;
        pVVar12->nSize = iVar3 + 1;
        pVVar12->pArray[iVar3] = pAVar10;
      }
      else {
        pVVar11 = Abc_FrameReadPoStatuses(pAVar4);
        pVVar12 = Abc_FrameReadCexVec(pAVar4);
        if (pVVar11 == (Vec_Int_t *)0x0) {
          __assert_fail("vStatusCur != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                        ,0x753,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
        }
        if (0 < (int)uVar14) {
          local_88 = (double)(ulong)uVar14;
          uVar15 = 0;
          do {
            if ((long)pVVar11->nSize <= (long)uVar15) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Vec_IntPush(pVVar7,pVVar11->pArray[uVar15]);
            pVVar2 = local_98;
            if (pVVar12 == (Vec_Ptr_t *)0x0) {
              pvVar6 = (void *)0x0;
            }
            else {
              if ((long)pVVar12->nSize <= (long)uVar15) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar6 = pVVar12->pArray[uVar15];
            }
            uVar14 = local_98->nCap;
            if (local_98->nSize == uVar14) {
              if ((int)uVar14 < 0x10) {
                if (local_98->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc(0x80);
                }
                else {
                  ppvVar9 = (void **)realloc(local_98->pArray,0x80);
                }
                pVVar2->pArray = ppvVar9;
                iVar3 = 0x10;
              }
              else {
                iVar3 = uVar14 * 2;
                if (iVar3 <= (int)uVar14) goto LAB_0078b9ba;
                if (local_98->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc((ulong)uVar14 << 4);
                }
                else {
                  ppvVar9 = (void **)realloc(local_98->pArray,(ulong)uVar14 << 4);
                }
                pVVar2->pArray = ppvVar9;
              }
              pVVar2->nCap = iVar3;
            }
LAB_0078b9ba:
            iVar3 = pVVar2->nSize;
            pVVar2->nSize = iVar3 + 1;
            pVVar2->pArray[iVar3] = pvVar6;
            uVar15 = uVar15 + 1;
          } while (uVar15 < (ulong)local_88);
        }
      }
      lVar13 = local_38 + local_68 + local_70;
      uVar15 = local_40;
    } while (local_40 != local_58);
    dVar21 = (double)lVar13;
    pGVar5 = local_50;
    lVar17 = local_60;
  }
  pVVar12 = local_98;
  uVar14 = local_98->nSize;
  uVar20 = pGVar5->vCos->nSize - pGVar5->nRegs;
  if (uVar14 != uVar20) {
    __assert_fail("Vec_PtrSize(vCexes) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x75c,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  uVar1 = pVVar7->nSize;
  uVar15 = (ulong)uVar1;
  if (uVar1 != uVar20) {
    __assert_fail("Vec_IntSize(vOutMap) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x75d,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if ((int)uVar14 < 1) {
    iVar3 = 0;
  }
  else {
    uVar19 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(local_98->pArray[uVar19] == (void *)0x0);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  local_88 = dVar21;
  if (iVar3 < (int)uVar14) {
    pAVar4 = local_78;
    Abc_FrameReplaceCexVec(local_78,&local_98);
    iVar3 = (int)pAVar4;
  }
  else {
    ppvVar9 = local_98->pArray;
    if (ppvVar9 != (void **)0x0) {
      free(ppvVar9);
      pVVar12->pArray = (void **)0x0;
    }
    iVar3 = (int)ppvVar9;
    if (pVVar12 != (Vec_Ptr_t *)0x0) {
      free(pVVar12);
      iVar3 = (int)pVVar12;
    }
  }
  uVar14 = 0;
  Abc_Print(iVar3,"SUMMARY:  ");
  Abc_Print(iVar3,"Properties = %6d. ",(ulong)(uint)(pGVar5->vCos->nSize - pGVar5->nRegs));
  if ((int)uVar1 < 1) {
    Abc_Print(iVar3,"UNSAT = %6d. ",0);
  }
  else {
    uVar19 = 0;
    uVar16 = 0;
    do {
      uVar16 = (ulong)((int)uVar16 + (uint)(pVVar7->pArray[uVar19] == 1));
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
    uVar19 = 0;
    Abc_Print(iVar3,"UNSAT = %6d. ",uVar16);
    if ((int)uVar1 < 1) {
      Abc_Print(iVar3,"SAT = %6d. ",0);
      goto LAB_0078bbd8;
    }
    uVar19 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + (pVVar7->pArray[uVar19] == 0);
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
  }
  uVar19 = 0;
  Abc_Print(iVar3,"SAT = %6d. ",(ulong)uVar14);
  if (0 < (int)uVar1) {
    uVar16 = 0;
    uVar19 = 0;
    do {
      uVar19 = (ulong)((int)uVar19 + (uint)(pVVar7->pArray[uVar16] == -1));
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
LAB_0078bbd8:
  Abc_Print(iVar3,"UNDEC = %6d. ",uVar19);
  Abc_Print(iVar3,"\n");
  Abc_Print(iVar3,"%s =","Command time");
  Abc_Print(iVar3,"%9.2f sec\n",local_88 / 1000000.0);
  iVar18 = 3;
  iVar3 = clock_gettime(3,&local_a8);
  __ptr = local_80;
  if (iVar3 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  Abc_Print(iVar18,"%s =","Total time  ");
  Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar13 + lVar17) / 1000000.0);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  Gia_ManStop(pGVar5);
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ManGroupProve( Gia_Man_t * pInit, char * pCommLine, int nGroupSize, int fVerbose )
{
    Abc_Frame_t * pAbc = Abc_FrameReadGlobalFrame();
    Gia_Man_t * p = Gia_ManDup( pInit );
    Gia_Man_t * pGroup;
    Vec_Int_t * vOuts;
    Vec_Int_t * vOutMap;
    Vec_Ptr_t * vCexes;
    int i, k, nGroupCur, nGroups;
    abctime clk, timeComm = 0;
    abctime timeStart = Abc_Clock();
    // pre-conditions
    assert( nGroupSize > 0 );
    assert( pCommLine != NULL );
    assert( p->nConstrs == 0 );
    Abc_Print( 1, "RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n", nGroupSize, pCommLine );
    // create output map
    vOuts   = Vec_IntStartNatural( Gia_ManPoNum(p) );
    vOutMap = Vec_IntAlloc( Gia_ManPoNum(p) );
    vCexes  = Vec_PtrAlloc( Gia_ManPoNum(p) );
    nGroups = Gia_ManPoNum(p) / nGroupSize + (int)((Gia_ManPoNum(p) % nGroupSize) > 0);
    for ( i = 0; i < nGroups; i++ )
    {
        // derive the group
        nGroupCur = ((i + 1) * nGroupSize < Gia_ManPoNum(p)) ? nGroupSize : Gia_ManPoNum(p) - i * nGroupSize;
        pGroup = Gia_ManDupCones( p, Vec_IntArray(vOuts) + i * nGroupSize, nGroupCur, 0 );
        Abc_Print( 1, "GROUP %4d : %4d <= PoId < %4d : ", i, i * nGroupSize, i * nGroupSize + nGroupCur );
        // set the current GIA
        Abc_FrameUpdateGia( pAbc, pGroup );
        // solve the group
        clk = Abc_Clock();
        Cmd_CommandExecute( pAbc, pCommLine );
        timeComm += Abc_Clock() - clk;
        // get the solution status
        if ( nGroupSize == 1 )
        {
            Vec_IntPush( vOutMap, Abc_FrameReadProbStatus(pAbc) );
            Vec_PtrPush( vCexes, Abc_FrameReadCex(pAbc) );
        }
        else // if ( nGroupSize > 1 )  
        {
            Vec_Int_t * vStatusCur = Abc_FrameReadPoStatuses( pAbc );
            Vec_Ptr_t * vCexesCur = Abc_FrameReadCexVec( pAbc );
            assert( vStatusCur != NULL ); // only works for "bmc3" and "pdr"
//            assert( vCexesCur != NULL );
            for ( k = 0; k < nGroupCur; k++ )
            {
                Vec_IntPush( vOutMap, Vec_IntEntry(vStatusCur, k) );
                Vec_PtrPush( vCexes, vCexesCur ? Vec_PtrEntry(vCexesCur, k) : NULL );
            }
        }
    }
    assert( Vec_PtrSize(vCexes) == Gia_ManPoNum(p) );
    assert( Vec_IntSize(vOutMap) == Gia_ManPoNum(p) );
    // set CEXes
    if ( Vec_PtrCountZero(vCexes) < Vec_PtrSize(vCexes) )
        Abc_FrameReplaceCexVec( pAbc, &vCexes );
    else  // there is no CEXes
        Vec_PtrFree( vCexes );
    // report the result
    Abc_Print( 1, "SUMMARY:  " );
    Abc_Print( 1, "Properties = %6d. ", Gia_ManPoNum(p) );
    Abc_Print( 1, "UNSAT = %6d. ",      Vec_IntCountEntry(vOutMap, 1) );
    Abc_Print( 1, "SAT = %6d. ",        Vec_IntCountEntry(vOutMap, 0) );
    Abc_Print( 1, "UNDEC = %6d. ",      Vec_IntCountEntry(vOutMap, -1) );
    Abc_Print( 1, "\n" );
    Abc_PrintTime( 1, "Command time", timeComm );
    Abc_PrintTime( 1, "Total time  ", Abc_Clock() - timeStart );
    // cleanup
    Vec_IntFree( vOuts );
    Gia_ManStop( p );
    return vOutMap;
}